

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_utils.cpp
# Opt level: O1

char16_t *
icu_63::number::impl::utils::getPatternForStyle
          (Locale *locale,char *nsName,CldrPatternStyle style,UErrorCode *status)

{
  int iVar1;
  char16_t *pcVar2;
  char16_t *pcVar3;
  char *patternKey;
  UErrorCode localStatus;
  LocalUResourceBundlePointer res;
  UErrorCode local_2c;
  LocalPointerBase<UResourceBundle> local_28;
  
  if (style - CLDR_PATTERN_STYLE_CURRENCY < 4) {
    patternKey = &DAT_0031be68 +
                 *(int *)(&DAT_0031be68 + (ulong)(style - CLDR_PATTERN_STYLE_CURRENCY) * 4);
  }
  else {
    patternKey = "decimalFormat";
  }
  local_28.ptr = ures_open_63((char *)0x0,locale->fullName,status);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    local_2c = U_ZERO_ERROR;
    pcVar2 = anon_unknown.dwarf_b4c87::doGetPattern(local_28.ptr,nsName,patternKey,status,&local_2c)
    ;
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      if ((U_ZERO_ERROR < local_2c) && (iVar1 = strcmp("latn",nsName), iVar1 != 0)) {
        local_2c = U_ZERO_ERROR;
        pcVar3 = anon_unknown.dwarf_b4c87::doGetPattern
                           (local_28.ptr,"latn",patternKey,status,&local_2c);
        pcVar2 = L"";
        if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
          pcVar2 = pcVar3;
        }
      }
      goto LAB_0021947a;
    }
  }
  pcVar2 = L"";
LAB_0021947a:
  LocalUResourceBundlePointer::~LocalUResourceBundlePointer
            ((LocalUResourceBundlePointer *)&local_28);
  return pcVar2;
}

Assistant:

const char16_t* utils::getPatternForStyle(const Locale& locale, const char* nsName, CldrPatternStyle style,
                                          UErrorCode& status) {
    const char* patternKey;
    switch (style) {
        case CLDR_PATTERN_STYLE_DECIMAL:
            patternKey = "decimalFormat";
            break;
        case CLDR_PATTERN_STYLE_CURRENCY:
            patternKey = "currencyFormat";
            break;
        case CLDR_PATTERN_STYLE_ACCOUNTING:
            patternKey = "accountingFormat";
            break;
        case CLDR_PATTERN_STYLE_PERCENT:
            patternKey = "percentFormat";
            break;
        case CLDR_PATTERN_STYLE_SCIENTIFIC:
            patternKey = "scientificFormat";
            break;
        default:
            patternKey = "decimalFormat"; // silence compiler error
            U_ASSERT(false);
    }
    LocalUResourceBundlePointer res(ures_open(nullptr, locale.getName(), &status));
    if (U_FAILURE(status)) { return u""; }

    // Attempt to get the pattern with the native numbering system.
    UErrorCode localStatus = U_ZERO_ERROR;
    const char16_t* pattern;
    pattern = doGetPattern(res.getAlias(), nsName, patternKey, status, localStatus);
    if (U_FAILURE(status)) { return u""; }

    // Fall back to latn if native numbering system does not have the right pattern
    if (U_FAILURE(localStatus) && uprv_strcmp("latn", nsName) != 0) {
        localStatus = U_ZERO_ERROR;
        pattern = doGetPattern(res.getAlias(), "latn", patternKey, status, localStatus);
        if (U_FAILURE(status)) { return u""; }
    }

    return pattern;
}